

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O0

void __thiscall test_matrix_sparse_erase_Test::TestBody(test_matrix_sparse_erase_Test *this)

{
  initializer_list<double> value;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> non_zero;
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  reference pvVar5;
  Scalar *pSVar6;
  char *regex;
  char *regex_00;
  char *regex_01;
  char *pcVar7;
  AssertHelper local_528;
  Message local_520 [6];
  exception *gtest_exception_2;
  size_t local_4d0 [2];
  iterator_element local_4c0;
  ReturnSentinel local_4a0;
  ReturnSentinel gtest_sentinel_2;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_2;
  pointer local_478;
  DeathTest *gtest_dt_2;
  Message local_468 [6];
  exception *gtest_exception_1;
  size_t local_418 [2];
  iterator_element local_408;
  ReturnSentinel local_3e8;
  ReturnSentinel gtest_sentinel_1;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_1;
  pointer local_3c0;
  DeathTest *gtest_dt_1;
  Message local_3b0;
  int local_3a4;
  exception *gtest_exception;
  size_t local_358 [2];
  iterator_element local_348;
  ReturnSentinel local_328;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_300;
  DeathTest *gtest_dt;
  Message local_2f0;
  size_t local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_5;
  Message local_2b0;
  pointer local_2a8;
  pointer local_2a0;
  undefined1 local_298 [16];
  undefined1 local_288 [8];
  AssertionResult gtest_ar_4;
  Message local_270;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_238;
  Message local_230;
  undefined8 local_228;
  undefined1 local_220 [55];
  bool local_1e9;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_;
  Message local_1d0;
  int local_1c4;
  size_t local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_2;
  Message local_1a0;
  int local_194;
  size_t local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_1;
  Message local_170;
  int local_164;
  size_t local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar;
  size_t local_138 [2];
  iterator_element local_128;
  undefined1 local_108 [8];
  iterator_element iter;
  unsigned_long local_b8 [4];
  iterator local_98;
  undefined8 local_90;
  unsigned_long local_88 [3];
  iterator local_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  Matrix_Sparse matrix;
  test_matrix_sparse_erase_Test *this_local;
  
  local_88[0] = 0;
  local_88[1] = 2;
  local_88[2] = 3;
  local_70 = local_88;
  local_68 = 3;
  local_b8[0] = 1;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_98 = local_b8;
  local_90 = 3;
  iter.matrix = (matrix_type *)0x3ff0000000000000;
  non_zero._M_len = 3;
  non_zero._M_array = local_70;
  index._M_len = 3;
  index._M_array = local_98;
  pcVar7 = (char *)0x2;
  value._M_len = 3;
  value._M_array = (iterator)&iter.matrix;
  matrix.column_size = (size_t)this;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_60,non_zero,index,value,2);
  local_138[1] = 0;
  local_138[0] = 1;
  Disa::Matrix_Sparse::find(&local_128,(Matrix_Sparse *)local_60,local_138 + 1,local_138);
  Disa::Matrix_Sparse::erase((iterator_element *)local_108,(Matrix_Sparse *)local_60,&local_128);
  local_160 = Disa::Matrix_Sparse::size_row((Matrix_Sparse *)local_60);
  local_164 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_158,"matrix.size_row()","2",&local_160,&local_164);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x14b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  local_190 = Disa::Matrix_Sparse::size_column((Matrix_Sparse *)local_60);
  local_194 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_188,"matrix.size_column()","2",&local_190,&local_194);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x14c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  local_1c0 = Disa::Matrix_Sparse::size_non_zero((Matrix_Sparse *)local_60);
  local_1c4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1b8,"matrix.size_non_zero()","2",&local_1c0,&local_1c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x14d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  local_228 = 0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_220,(size_t *)local_60);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            ((iterator *)(local_220 + 0x10),(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_220);
  local_1e9 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::operator==
                        ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_108,
                         (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)(local_220 + 0x10));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e8,&local_1e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_1e8,
               (AssertionResult *)"iter == matrix[0].end()","false","true",pcVar7);
    pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_3.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x14e,pcVar7);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  pvVar5 = Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::
           operator*<Disa::Matrix_Sparse,_true>
                     ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_108);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_268,"*iter","3.0",*pvVar5,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x14f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  local_2a0 = (pointer)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_298,(size_t *)local_60);
  local_2a8 = (pointer)0x0;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_298,(size_t *)&local_2a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_288,"matrix[0][0]","2.0",*pSVar6,2.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x150,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  local_2e8[1] = 1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_2d8,(size_t *)local_60);
  local_2e8[0] = 0;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_2d8,local_2e8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2c8,"matrix[1][0]","3.0",*pSVar6,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x151,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)"./*",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("matrix.erase(matrix.find(3, 0))",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x154,&local_300);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00124b48;
    if (local_300 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_300);
      iVar2 = (*local_300->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_300->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_300->_vptr_DeathTest[4])(local_300,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00124b0a;
        local_3a4 = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_328,local_300);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_358[1] = 3;
            local_358[0] = 0;
            Disa::Matrix_Sparse::find(&local_348,(Matrix_Sparse *)local_60,local_358 + 1,local_358);
            Disa::Matrix_Sparse::erase
                      ((iterator_element *)&gtest_exception,(Matrix_Sparse *)local_60,&local_348);
          }
          (*local_300->_vptr_DeathTest[5])(local_300,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_328);
        }
LAB_00124b0a:
        local_3a4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_3a4 != 0) goto LAB_00124b48;
    }
  }
  else {
LAB_00124b48:
    testing::Message::Message(&local_3b0);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x154,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_1,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_1);
    testing::Message::~Message(&local_3b0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1,(internal *)"./*",regex_00);
    bVar1 = testing::internal::DeathTest::Create
                      ("matrix.erase(matrix.find(0, 2))",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x155,&local_3c0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00124ff5;
    if (local_3c0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_1,local_3c0);
      iVar2 = (*local_3c0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_3c0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_3c0->_vptr_DeathTest[4])(local_3c0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00124fb7;
        local_3a4 = 4;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_3e8,local_3c0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_418[1] = 0;
            local_418[0] = 2;
            Disa::Matrix_Sparse::find(&local_408,(Matrix_Sparse *)local_60,local_418 + 1,local_418);
            Disa::Matrix_Sparse::erase
                      ((iterator_element *)&gtest_exception_1,(Matrix_Sparse *)local_60,&local_408);
          }
          (*local_3c0->_vptr_DeathTest[5])(local_3c0,2);
          local_3a4 = 5;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_3e8);
        }
LAB_00124fb7:
        local_3a4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_1);
      if (local_3a4 != 0) goto LAB_00124ff5;
    }
  }
  else {
LAB_00124ff5:
    testing::Message::Message(local_468);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x155,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_2,local_468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_2);
    testing::Message::~Message(local_468);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2,(internal *)"./*",regex_01);
    bVar1 = testing::internal::DeathTest::Create
                      ("matrix.erase(matrix.find(1, 1))",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x156,&local_478);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_478 == (pointer)0x0) goto LAB_00125553;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_2,local_478);
      iVar2 = (*local_478->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_478->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_478->_vptr_DeathTest[4])(local_478,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00125464;
        local_3a4 = 6;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_4a0,local_478);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_4d0[1] = 1;
            local_4d0[0] = 1;
            Disa::Matrix_Sparse::find(&local_4c0,(Matrix_Sparse *)local_60,local_4d0 + 1,local_4d0);
            Disa::Matrix_Sparse::erase
                      ((iterator_element *)&gtest_exception_2,(Matrix_Sparse *)local_60,&local_4c0);
          }
          (*local_478->_vptr_DeathTest[5])(local_478,2);
          local_3a4 = 7;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_4a0);
        }
LAB_00125464:
        local_3a4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_2);
      if (local_3a4 == 0) goto LAB_00125553;
    }
  }
  testing::Message::Message(local_520);
  pcVar7 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_528,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
             ,0x156,pcVar7);
  testing::internal::AssertHelper::operator=(&local_528,local_520);
  testing::internal::AssertHelper::~AssertHelper(&local_528);
  testing::Message::~Message(local_520);
LAB_00125553:
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_60);
  return;
}

Assistant:

TEST(test_matrix_sparse, erase) {
  Matrix_Sparse matrix({0, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2);
  auto iter = matrix.erase(matrix.find(0, 1));
  EXPECT_EQ(matrix.size_row(), 2);
  EXPECT_EQ(matrix.size_column(), 2);
  EXPECT_EQ(matrix.size_non_zero(), 2);
  EXPECT_TRUE(iter == matrix[0].end());  // should point to end
  EXPECT_DOUBLE_EQ(*iter, 3.0);          // end should be the next row over.
  EXPECT_DOUBLE_EQ(matrix[0][0], 2.0);
  EXPECT_DOUBLE_EQ(matrix[1][0], 3.0);

  // Check debug undefined behaviour
  EXPECT_DEATH(matrix.erase(matrix.find(3, 0)), "./*");
  EXPECT_DEATH(matrix.erase(matrix.find(0, 2)), "./*");
  EXPECT_DEATH(matrix.erase(matrix.find(1, 1)), "./*");
}